

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

bool __thiscall cppcms::http::request::prepare(request *this)

{
  bool bVar1;
  char *__s;
  longlong lVar2;
  _data *p_Var3;
  long in_RDI;
  char *query;
  form_type *in_stack_00000090;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  request *in_stack_000000a8;
  request *in_stack_00000690;
  
  __s = (char *)(**(code **)(**(long **)(in_RDI + 200) + 200))();
  strlen(__s);
  bVar1 = parse_form_urlencoded
                    (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  if (!bVar1) {
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x3915de);
  }
  parse_cookies(in_stack_00000690);
  lVar2 = (**(code **)(**(long **)(in_RDI + 200) + 0xd8))();
  p_Var3 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                     ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
  p_Var3->content_length = lVar2;
  p_Var3 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                     ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
  if (p_Var3->content_length == 0) {
    p_Var3 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                       ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
    p_Var3->ready = true;
  }
  return true;
}

Assistant:

bool request::prepare()
{
	char const *query=conn_->env_query_string();
	if(!parse_form_urlencoded(query,query + strlen(query),get_))  {
		get_.clear();
	}
	parse_cookies();
	d->content_length = conn_->env_content_length();
	if(d->content_length == 0)
		d->ready = true;
	return true;
}